

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O0

void __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::FreeAllocations(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
                  *this,bool release)

{
  bool bVar1;
  char16 *filename;
  ThreadContext *this_00;
  TEmitBufferAllocation *local_38;
  TEmitBufferAllocation *allocation;
  AutoRealOrFakeCriticalSection<CriticalSection> local_20;
  AutoRealOrFakeCriticalSection<CriticalSection> autoCs;
  bool release_local;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
  *this_local;
  
  autoCs.cs._7_1_ = release;
  AutoRealOrFakeCriticalSection<CriticalSection>::AutoRealOrFakeCriticalSection
            (&local_20,&this->criticalSection);
  if (((autoCs.cs._7_1_ & 1) == 0) &&
     (bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ebe7c8,EmitterPhase), bVar1)) {
    filename = Js::String::operator_cast_to_char16_t_((String *)&DAT_01ea4190);
    DumpAndResetStats(this,filename);
  }
  for (local_38 = this->allocations; local_38 != (TEmitBufferAllocation *)0x0;
      local_38 = local_38->nextAllocation) {
    if ((DAT_01e9e30c & 1) != 0) {
      CheckBufferPermissions(this,local_38);
    }
    if ((autoCs.cs._7_1_ & 1) == 0) {
      if ((this->scriptContext != (ScriptContext *)0x0) && ((local_38->recorded & 1U) != 0)) {
        this_00 = Js::ScriptContext::GetThreadContext(this->scriptContext);
        ThreadContext::SubCodeSize(this_00,local_38->bytesCommitted);
        local_38->recorded = false;
      }
    }
    else {
      Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
      ::Free(&this->allocationHeap,local_38->allocation);
    }
  }
  if ((autoCs.cs._7_1_ & 1) == 0) {
    Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
    DecommitAll(&this->allocationHeap);
  }
  else {
    this->allocations = (TEmitBufferAllocation *)0x0;
  }
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection(&local_20);
  return;
}

Assistant:

void
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::FreeAllocations(bool release)
{
#if PDATA_ENABLED && defined(_WIN32)
    DelayDeletingFunctionTable::Clear();
#endif

    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

#if DBG_DUMP
    if (!release && PHASE_STATS1(Js::EmitterPhase))
    {
        this->DumpAndResetStats(Js::Configuration::Global.flags.Filename);
    }
#endif

    TEmitBufferAllocation * allocation = this->allocations;
    while (allocation != nullptr)
    {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if(CONFIG_FLAG(CheckEmitBufferPermissions))
        {
            CheckBufferPermissions(allocation);
        }
#endif
        if (release)
        {
            this->allocationHeap.Free(allocation->allocation);
        }
        else if ((scriptContext != nullptr) && allocation->recorded)
        {
            // In case of ThunkEmitter the script context would be null and we don't want to track that as code size.
            this->scriptContext->GetThreadContext()->SubCodeSize(allocation->bytesCommitted);
            allocation->recorded = false;
        }

        allocation = allocation->nextAllocation;
    }
    if (release)
    {
        this->allocations = nullptr;
    }
    else
    {
        this->allocationHeap.DecommitAll();
    }
}